

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O1

bool udpdiscovery::impl::SerializeString
               (SerializeDirection direction,string *value,int value_size,BufferView *buffer_view)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  
  bVar2 = true;
  if (direction == kParse) {
    if ((int)buffer_view->buffer_->_M_string_length < buffer_view->parsed_ + value_size) {
      bVar2 = false;
    }
    else {
      std::__cxx11::string::resize((ulong)value,(char)value_size);
      if (0 < value_size) {
        uVar3 = 0;
        do {
          cVar1 = BufferView::Read(buffer_view);
          (value->_M_dataplus)._M_p[uVar3] = cVar1;
          uVar3 = uVar3 + 1;
        } while ((uint)value_size != uVar3);
      }
    }
  }
  else if (direction == kSerialize) {
    std::__cxx11::string::replace
              ((ulong)buffer_view->buffer_,buffer_view->buffer_->_M_string_length,(char *)0x0,
               (ulong)(value->_M_dataplus)._M_p);
  }
  return bVar2;
}

Assistant:

bool SerializeString(SerializeDirection direction, std::string* value,
                     int value_size, BufferView* buffer_view) {
  switch (direction) {
    case kSerialize:
      buffer_view->InsertBack(*value, value_size);
      break;

    case kParse:
      if (!buffer_view->CanRead(value_size)) {
        return false;
      }
      value->resize(value_size);
      for (int i = 0; i < (int)value_size; ++i) {
        (*value)[i] = buffer_view->Read();
      }
      break;
  }

  return true;
}